

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMig.c
# Opt level: O0

int Mig_ManSuppSizeOne(Mig_Obj_t *pObj)

{
  int iVar1;
  Mig_Man_t *p;
  Mig_Obj_t *pObj_local;
  
  Mig_ObjIncrementTravId(pObj);
  p = Mig_ObjMan(pObj);
  iVar1 = Mig_ObjId(pObj);
  iVar1 = Mig_ManSuppSize2_rec(p,iVar1);
  return iVar1;
}

Assistant:

int Mig_ManSuppSizeOne( Mig_Obj_t * pObj )
{
    Mig_ObjIncrementTravId( pObj );
//    return Mig_ManSuppSize_rec( pObj );
    return Mig_ManSuppSize2_rec( Mig_ObjMan(pObj), Mig_ObjId(pObj) );
}